

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

bool __thiscall
bssl::Vector<NotDefaultConstructible>::Push
          (Vector<NotDefaultConstructible> *this,NotDefaultConstructible *elem)

{
  bool bVar1;
  NotDefaultConstructible *elem_local;
  Vector<NotDefaultConstructible> *this_local;
  
  bVar1 = MaybeGrow(this);
  if (bVar1) {
    anon_unknown_0::VectorTest_NotDefaultConstructible_Test::TestBody::NotDefaultConstructible::
    NotDefaultConstructible(this->data_ + this->size_,elem);
    this->size_ = this->size_ + 1;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] bool Push(T elem) {
    if (!MaybeGrow()) {
      return false;
    }
    new (&data_[size_]) T(std::move(elem));
    size_++;
    return true;
  }